

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void Js::JavascriptPromise::InitializePromise
               (JavascriptPromise *promise,JavascriptPromiseResolveOrRejectFunction **resolve,
               JavascriptPromiseResolveOrRejectFunction **reject,ScriptContext *scriptContext)

{
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *addr;
  Recycler *pRVar4;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord;
  JavascriptPromiseResolveOrRejectFunction *pJVar5;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  if (promise->status != PromiseStatusCode_Undefined) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x67,"(promise->GetStatus() == PromiseStatusCode_Undefined)",
                                "promise->GetStatus() == PromiseStatusCode_Undefined");
    if (!bVar2) goto LAB_00cfbfa8;
    *puVar3 = 0;
  }
  if (resolve == (JavascriptPromiseResolveOrRejectFunction **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x68,"(resolve)","resolve");
    if (!bVar2) goto LAB_00cfbfa8;
    *puVar3 = 0;
  }
  data._32_8_ = resolve;
  if (reject == (JavascriptPromiseResolveOrRejectFunction **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x69,"(reject)","reject");
    if (!bVar2) {
LAB_00cfbfa8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar4 = scriptContext->recycler;
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  promise->status = PromiseStatusCode_Unresolved;
  local_78 = (undefined1  [8])
             &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7bb7f26;
  data.filename._0_4_ = 0x70;
  alloc = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_78);
  addr = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
         new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  (addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler> = 0;
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  Memory::Recycler::WBSetBit((char *)addr);
  *(SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> **)
   &addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  addr->allocator = pRVar4;
  Memory::Recycler::WBSetBit((char *)&promise->reactions);
  (promise->reactions).ptr = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&promise->reactions);
  local_78 = (undefined1  [8])
             &JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7bb7f26;
  data.filename._0_4_ = 0x72;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  alreadyResolvedRecord =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
       new<Memory::Recycler>(1,pRVar4,0x572640);
  alreadyResolvedRecord->alreadyResolved = false;
  pJVar5 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (this,EntryResolveOrRejectFunction,promise,false,alreadyResolvedRecord);
  *(JavascriptPromiseResolveOrRejectFunction **)data._32_8_ = pJVar5;
  pJVar5 = JavascriptLibrary::CreatePromiseResolveOrRejectFunction
                     (this,EntryResolveOrRejectFunction,promise,true,alreadyResolvedRecord);
  *reject = pJVar5;
  return;
}

Assistant:

void JavascriptPromise::InitializePromise(JavascriptPromise* promise, JavascriptPromiseResolveOrRejectFunction** resolve, JavascriptPromiseResolveOrRejectFunction** reject, ScriptContext* scriptContext)
    {
        Assert(promise->GetStatus() == PromiseStatusCode_Undefined);
        Assert(resolve);
        Assert(reject);

        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        promise->SetStatus(PromiseStatusCode_Unresolved);

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);

        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = false;

        *resolve = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, false, alreadyResolvedRecord);
        *reject = library->CreatePromiseResolveOrRejectFunction(EntryResolveOrRejectFunction, promise, true, alreadyResolvedRecord);
    }